

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool container_iterator_prev
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,uint16_t *value)

{
  int iVar1;
  ushort *in_RCX;
  int *in_RDX;
  char in_SIL;
  long in_RDI;
  bool bVar2;
  run_container_t *rc;
  array_container_t *ac;
  uint64_t word;
  int32_t wordindex;
  bitset_container_t *bc;
  undefined8 local_40;
  undefined4 local_34;
  undefined1 local_1;
  
  if (in_SIL == '\x01') {
    iVar1 = *in_RDX;
    *in_RDX = iVar1 + -1;
    if (iVar1 + -1 < 0) {
      local_1 = false;
    }
    else {
      local_34 = *in_RDX / 0x40;
      local_40 = *(ulong *)(*(long *)(in_RDI + 8) + (long)local_34 * 8) &
                 0xffffffffffffffffU >> (0x3fU - (char)(*in_RDX % 0x40) & 0x3f);
      while( true ) {
        bVar2 = false;
        if (local_40 == 0) {
          local_34 = local_34 + -1;
          bVar2 = -1 < local_34;
        }
        if (!bVar2) break;
        local_40 = *(unsigned_long_long *)(*(long *)(in_RDI + 8) + (long)local_34 * 8);
      }
      if (local_40 == 0) {
        local_1 = false;
      }
      else {
        iVar1 = roaring_leading_zeroes(local_40);
        *in_RDX = local_34 * 0x40 + (0x3f - iVar1);
        *in_RCX = (ushort)*in_RDX;
        local_1 = true;
      }
    }
  }
  else if (in_SIL == '\x02') {
    iVar1 = *in_RDX;
    *in_RDX = iVar1 + -1;
    if (iVar1 + -1 < 0) {
      local_1 = false;
    }
    else {
      *in_RCX = *(ushort *)(*(long *)(in_RDI + 8) + (long)*in_RDX * 2);
      local_1 = true;
    }
  }
  else if (*in_RCX == 0) {
    local_1 = false;
  }
  else {
    *in_RCX = *in_RCX - 1;
    if (*in_RCX < *(ushort *)(*(long *)(in_RDI + 8) + (long)*in_RDX * 4)) {
      iVar1 = *in_RDX;
      *in_RDX = iVar1 + -1;
      if (iVar1 + -1 < 0) {
        local_1 = false;
      }
      else {
        *in_RCX = *(short *)(*(long *)(in_RDI + 8) + (long)*in_RDX * 4) +
                  *(short *)(*(long *)(in_RDI + 8) + 2 + (long)*in_RDX * 4);
        local_1 = true;
      }
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool container_iterator_prev(const container_t *c, uint8_t typecode,
                             roaring_container_iterator_t *it,
                             uint16_t *value) {
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            if (--it->index < 0) {
                return false;
            }

            const bitset_container_t *bc = const_CAST_bitset(c);
            int32_t wordindex = it->index / 64;
            uint64_t word =
                bc->words[wordindex] & (UINT64_MAX >> (63 - (it->index % 64)));

            while (word == 0 && --wordindex >= 0) {
                word = bc->words[wordindex];
            }
            if (word == 0) {
                return false;
            }

            it->index = (wordindex * 64) + (63 - roaring_leading_zeroes(word));
            *value = it->index;
            return true;
        }
        case ARRAY_CONTAINER_TYPE: {
            if (--it->index < 0) {
                return false;
            }
            const array_container_t *ac = const_CAST_array(c);
            *value = ac->array[it->index];
            return true;
        }
        case RUN_CONTAINER_TYPE: {
            if (*value == 0) {
                return false;
            }

            const run_container_t *rc = const_CAST_run(c);
            (*value)--;
            if (*value >= rc->runs[it->index].value) {
                return true;
            }

            if (--it->index < 0) {
                return false;
            }

            *value = rc->runs[it->index].value + rc->runs[it->index].length;
            return true;
        }
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}